

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::Config::Config(Config *this,ConfigData *data)

{
  string *psVar1;
  pointer pRVar2;
  byte bVar3;
  char *pcVar4;
  ColourMode *pCVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *elem;
  string *psVar6;
  pointer pRVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  bool bVar9;
  StringRef reporterSpec;
  ReusableStringStream local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b0;
  undefined1 local_1a8 [64];
  ColourMode local_168;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_160;
  TestSpecParser parser;
  
  (this->super_IConfig)._vptr_IConfig = (_func_int **)&PTR__Config_001a4270;
  ConfigData::ConfigData(&this->m_data,data);
  *(undefined8 *)
   ((long)&(this->m_testSpec).m_invalidSpecs.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->m_testSpec).m_invalidSpecs.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->m_testSpec).m_invalidSpecs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_testSpec).m_invalidSpecs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_testSpec).m_filters.
  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_testSpec).m_filters.
  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_processedReporterSpecs).
  super__Vector_base<Catch::ProcessedReporterSpec,_std::allocator<Catch::ProcessedReporterSpec>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_testSpec).m_filters.
  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_processedReporterSpecs).
  super__Vector_base<Catch::ProcessedReporterSpec,_std::allocator<Catch::ProcessedReporterSpec>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_processedReporterSpecs).
  super__Vector_base<Catch::ProcessedReporterSpec,_std::allocator<Catch::ProcessedReporterSpec>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  psVar1 = (this->m_data).testsOrTags.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar6 = (this->m_data).testsOrTags.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar6 != psVar1; psVar6 = psVar6 + 1) {
    trim((string *)&parser,psVar6);
    std::__cxx11::string::operator=((string *)psVar6,(string *)&parser);
    std::__cxx11::string::~string((string *)&parser);
  }
  psVar1 = (this->m_data).sectionsToRun.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar6 = (this->m_data).sectionsToRun.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar6 != psVar1; psVar6 = psVar6 + 1) {
    trim((string *)&parser,psVar6);
    std::__cxx11::string::operator=((string *)psVar6,(string *)&parser);
    std::__cxx11::string::~string((string *)&parser);
  }
  if ((this->m_data).reporterSpecifications.
      super__Vector_base<Catch::ReporterSpec,_std::allocator<Catch::ReporterSpec>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->m_data).reporterSpecifications.
      super__Vector_base<Catch::ReporterSpec,_std::allocator<Catch::ReporterSpec>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    reporterSpec.m_size = 7;
    reporterSpec.m_start = "console";
    parseReporterSpec((Optional<Catch::ReporterSpec> *)&parser,reporterSpec);
    if (parser._0_8_ == 0) {
      ReusableStringStream::ReusableStringStream(&local_1c0);
      std::operator<<(local_1c0.m_oss,"Cannot parse the provided default reporter spec: \'");
      std::operator<<(local_1c0.m_oss,"console");
      std::operator<<(local_1c0.m_oss,'\'');
      std::__cxx11::stringbuf::str();
      throw_domain_error((string *)local_1a8);
    }
    std::vector<Catch::ReporterSpec,_std::allocator<Catch::ReporterSpec>_>::
    emplace_back<Catch::ReporterSpec>
              (&(this->m_data).reporterSpecifications,(ReporterSpec *)parser._0_8_);
    Optional<Catch::ReporterSpec>::reset((Optional<Catch::ReporterSpec> *)&parser);
  }
  pcVar4 = getenv("BAZEL_TEST");
  if (pcVar4 != (char *)0x0) {
    readBazelEnvVars(this);
  }
  parser.m_tagAliases = ITagAliasRegistry::get();
  parser.m_arg._M_dataplus._M_p = (pointer)&parser.m_arg.field_2;
  parser.m_mode = None;
  parser.lastMode = None;
  parser.m_exclusion = false;
  parser.m_pos = 0;
  parser.m_realPatternPos = 0;
  parser.m_arg._M_string_length = 0;
  parser.m_arg.field_2._M_local_buf[0] = '\0';
  parser.m_substring._M_dataplus._M_p = (pointer)&parser.m_substring.field_2;
  parser.m_substring._M_string_length = 0;
  parser.m_substring.field_2._M_local_buf[0] = '\0';
  parser.m_patternName._M_dataplus._M_p = (pointer)&parser.m_patternName.field_2;
  parser.m_patternName._M_string_length = 0;
  parser.m_patternName.field_2._M_local_buf[0] = '\0';
  parser.m_escapeChars.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  parser.m_escapeChars.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  parser.m_escapeChars.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  parser.m_currentFilter.m_required.
  super__Vector_base<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  parser.m_currentFilter.m_required.
  super__Vector_base<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  parser.m_currentFilter.m_required.
  super__Vector_base<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  parser.m_currentFilter.m_forbidden.
  super__Vector_base<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  parser.m_currentFilter.m_forbidden.
  super__Vector_base<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  parser.m_currentFilter.m_forbidden.
  super__Vector_base<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  parser.m_testSpec.m_filters.
  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  parser.m_testSpec.m_filters.
  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  parser.m_testSpec.m_filters.
  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  parser.m_testSpec.m_invalidSpecs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  parser.m_testSpec.m_invalidSpecs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  parser.m_testSpec.m_invalidSpecs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar6 = (this->m_data).testsOrTags.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->m_data).testsOrTags.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar6 != psVar1) {
    this->m_hasTestFilters = true;
    for (; psVar6 != psVar1; psVar6 = psVar6 + 1) {
      TestSpecParser::parse(&parser,psVar6);
    }
  }
  TestSpecParser::testSpec((TestSpec *)local_1a8,&parser);
  TestSpec::operator=(&this->m_testSpec,(TestSpec *)local_1a8);
  TestSpec::~TestSpec((TestSpec *)local_1a8);
  pRVar7 = (this->m_data).reporterSpecifications.
           super__Vector_base<Catch::ReporterSpec,_std::allocator<Catch::ReporterSpec>_>._M_impl.
           super__Vector_impl_data._M_start;
  pRVar2 = (this->m_data).reporterSpecifications.
           super__Vector_base<Catch::ReporterSpec,_std::allocator<Catch::ReporterSpec>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_1b0 = &data->defaultOutputFilename;
  bVar3 = 0;
  while( true ) {
    if (pRVar7 == pRVar2) {
      TestSpecParser::~TestSpecParser(&parser);
      return;
    }
    bVar9 = (pRVar7->m_outputFileName).nullableValue ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((bool)(bVar9 & bVar3)) break;
    std::__cxx11::string::string((string *)local_1a8,(string *)pRVar7);
    pbVar8 = (pRVar7->m_outputFileName).nullableValue;
    if (pbVar8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pbVar8 = local_1b0;
    }
    std::__cxx11::string::string((string *)(local_1a8 + 0x20),(string *)pbVar8);
    pCVar5 = (pRVar7->m_colourMode).nullableValue;
    if (pCVar5 == (ColourMode *)0x0) {
      pCVar5 = &data->defaultColourMode;
    }
    local_168 = *pCVar5;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_Rb_tree(&local_160,&(pRVar7->m_customOptions)._M_t);
    std::vector<Catch::ProcessedReporterSpec,_std::allocator<Catch::ProcessedReporterSpec>_>::
    emplace_back<Catch::ProcessedReporterSpec>
              (&this->m_processedReporterSpecs,(ProcessedReporterSpec *)local_1a8);
    bVar3 = bVar3 | bVar9;
    ProcessedReporterSpec::~ProcessedReporterSpec((ProcessedReporterSpec *)local_1a8);
    pRVar7 = pRVar7 + 1;
  }
  ReusableStringStream::ReusableStringStream(&local_1c0);
  std::operator<<(local_1c0.m_oss,"Internal error: cannot use default output for multiple reporters"
                 );
  std::__cxx11::stringbuf::str();
  throw_domain_error((string *)local_1a8);
}

Assistant:

Config::Config( ConfigData const& data ):
        m_data( data ) {
        // We need to trim filter specs to avoid trouble with superfluous
        // whitespace (esp. important for bdd macros, as those are manually
        // aligned with whitespace).

        for (auto& elem : m_data.testsOrTags) {
            elem = trim(elem);
        }
        for (auto& elem : m_data.sectionsToRun) {
            elem = trim(elem);
        }

        // Insert the default reporter if user hasn't asked for a specific one
        if ( m_data.reporterSpecifications.empty() ) {
#if defined( CATCH_CONFIG_DEFAULT_REPORTER )
            const auto default_spec = CATCH_CONFIG_DEFAULT_REPORTER;
#else
            const auto default_spec = "console";
#endif
            auto parsed = parseReporterSpec(default_spec);
            CATCH_ENFORCE( parsed,
                           "Cannot parse the provided default reporter spec: '"
                               << default_spec << '\'' );
            m_data.reporterSpecifications.push_back( std::move( *parsed ) );
        }

        if ( enableBazelEnvSupport() ) {
            readBazelEnvVars();
        }

        // Bazel support can modify the test specs, so parsing has to happen
        // after reading Bazel env vars.
        TestSpecParser parser( ITagAliasRegistry::get() );
        if ( !m_data.testsOrTags.empty() ) {
            m_hasTestFilters = true;
            for ( auto const& testOrTags : m_data.testsOrTags ) {
                parser.parse( testOrTags );
            }
        }
        m_testSpec = parser.testSpec();


        // We now fixup the reporter specs to handle default output spec,
        // default colour spec, etc
        bool defaultOutputUsed = false;
        for ( auto const& reporterSpec : m_data.reporterSpecifications ) {
            // We do the default-output check separately, while always
            // using the default output below to make the code simpler
            // and avoid superfluous copies.
            if ( reporterSpec.outputFile().none() ) {
                CATCH_ENFORCE( !defaultOutputUsed,
                               "Internal error: cannot use default output for "
                               "multiple reporters" );
                defaultOutputUsed = true;
            }

            m_processedReporterSpecs.push_back( ProcessedReporterSpec{
                reporterSpec.name(),
                reporterSpec.outputFile() ? *reporterSpec.outputFile()
                                          : data.defaultOutputFilename,
                reporterSpec.colourMode().valueOr( data.defaultColourMode ),
                reporterSpec.customOptions() } );
        }
    }